

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_tour(Tour *t)

{
  uint uVar1;
  uint *puVar2;
  uint local_14;
  int32_t next_vertex;
  int32_t curr_vertex;
  Tour *t_local;
  
  printf("%-16s ","TOUR:");
  local_14 = 0;
  while( true ) {
    puVar2 = (uint *)tsucc(t,local_14);
    uVar1 = *puVar2;
    if (uVar1 == 0) break;
    printf("%d ",(ulong)local_14);
    local_14 = uVar1;
  }
  printf("%d",(ulong)local_14);
  printf("\n");
  return;
}

Assistant:

static void print_tour(Tour *t) {
    printf("%-16s ", "TOUR:");

    int32_t curr_vertex = 0;
    int32_t next_vertex = curr_vertex;

    do {
        next_vertex = *tsucc(t, curr_vertex);
        if (next_vertex == 0) {
            // Do not put the space for cleanliness if is the last vertex to be
            // printed
            printf("%d", curr_vertex);
        } else {
            printf("%d ", curr_vertex);
        }
        curr_vertex = next_vertex;
    } while (curr_vertex != 0);

    printf("\n");
}